

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O1

bool P_CheckFor3DCeilingHit(AActor *mo,double z)

{
  extsector_t *peVar1;
  F3DFloor **ppFVar2;
  undefined8 *puVar3;
  long lVar4;
  double *pdVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  if ((mo->player == (player_t *)0x0) || ((mo->player->cheats & 0x2000) == 0)) {
    peVar1 = mo->Sector->e;
    uVar8 = (ulong)(peVar1->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    bVar9 = uVar8 != 0;
    if (bVar9) {
      ppFVar2 = (peVar1->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
      lVar7 = 0;
      do {
        puVar3 = *(undefined8 **)((long)ppFVar2 + lVar7);
        iVar6 = 3;
        if (((*(uint *)(puVar3 + 0xb) & 1) != 0) && (iVar6 = 0, (*(uint *)(puVar3 + 0xb) & 2) != 0))
        {
          lVar4 = *(long *)(puVar3[0xd] + 0x1e8);
          if (lVar4 != 0) {
            if ((*(byte *)(lVar4 + 0x20) & 0x20) == 0) {
              pdVar5 = (double *)*puVar3;
              if (ABS(z - (pdVar5[1] * (mo->__Pos).Y + *pdVar5 * (mo->__Pos).X + pdVar5[3]) *
                          pdVar5[4]) < 1.52587890625e-05) {
                ASectorAction::TriggerAction(*(ASectorAction **)(puVar3[0xd] + 0x1e8),mo,8);
                iVar6 = 1;
              }
            }
            else {
              *(undefined8 *)(puVar3[0xd] + 0x1e8) = 0;
            }
          }
        }
        if ((iVar6 != 3) && (iVar6 != 0)) {
          return bVar9;
        }
        lVar7 = lVar7 + 8;
        bVar9 = uVar8 << 3 != lVar7;
      } while (bVar9);
    }
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool P_CheckFor3DCeilingHit(AActor * mo, double z)
{
	if ((mo->player && (mo->player->cheats & CF_PREDICTING))) return false;

	for (auto rover : mo->Sector->e->XFloor.ffloors)
	{
		if (!(rover->flags & FF_EXISTS)) continue;

		if(rover->flags & FF_SOLID && rover->model->SecActTarget)
		{
			if(fabs(z - rover->bottom.plane->ZatPoint(mo)) < EQUAL_EPSILON)
			{
				rover->model->SecActTarget->TriggerAction (mo, SECSPAC_HitCeiling);
				return true;
			}
		}
	}
	return false;
}